

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

ssize_t __thiscall VectorWriter::write(VectorWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  ulong uVar2;
  pointer puVar3;
  void *__n_00;
  undefined4 in_register_00000034;
  void *__src;
  ulong uVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->nPos;
  puVar3 = (this->vchData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->vchData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  pvVar5 = (void *)(uVar4 - uVar2);
  if (uVar4 < uVar2) {
    __assert_fail("nPos <= vchData.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/streams.h"
                  ,0x4c,"void VectorWriter::write(Span<const std::byte>)");
  }
  __n_00 = __buf;
  if (pvVar5 < __buf) {
    __n_00 = pvVar5;
  }
  if (__n_00 != (void *)0x0) {
    memcpy(puVar3 + uVar2,__src,(size_t)__n_00);
  }
  if (pvVar5 < __buf) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this->vchData,
               (const_iterator)
               *(uchar **)((vector<unsigned_char,std::allocator<unsigned_char>> *)this->vchData + 8)
               ,(uchar *)((long)pvVar5 + (long)__src),(uchar *)((long)__src + (long)__buf));
  }
  this->nPos = this->nPos + (long)__buf;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void write(Span<const std::byte> src)
    {
        assert(nPos <= vchData.size());
        size_t nOverwrite = std::min(src.size(), vchData.size() - nPos);
        if (nOverwrite) {
            memcpy(vchData.data() + nPos, src.data(), nOverwrite);
        }
        if (nOverwrite < src.size()) {
            vchData.insert(vchData.end(), UCharCast(src.data()) + nOverwrite, UCharCast(src.end()));
        }
        nPos += src.size();
    }